

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmtr.c
# Opt level: O3

void rescan_config(void)

{
  char **ppcVar1;
  job_t *pjVar2;
  ctor_f *pcVar3;
  size_t __n;
  UT_array *jobs;
  int iVar4;
  job_t *em;
  char *pcVar5;
  UT_array *pUVar6;
  job_t *pjVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  job_t *pjVar12;
  job_t *pjVar13;
  long lVar14;
  size_t _ut_i;
  bool bVar15;
  
  syslog(6,"rescanning job configuration");
  em = (job_t *)calloc(0x18,1);
  if (em != (job_t *)0x0) {
    pcVar5 = (char *)malloc(100);
    em->name = pcVar5;
    if (pcVar5 != (char *)0x0) {
      (em->cmdv).i = 100;
      (em->cmdv).n = 0;
      *pcVar5 = '\0';
      jobs = cfg.jobs;
      pUVar6 = (UT_array *)calloc(1,0x30);
      (pUVar6->icd).sz = 0x218;
      (pUVar6->icd).init = job_ini;
      (pUVar6->icd).copy = job_cpy;
      (pUVar6->icd).dtor = job_fin;
      cfg.jobs = pUVar6;
      close_sockets(&cfg);
      pjVar12 = em;
      iVar4 = parse_jobs(&cfg,(UT_string *)em);
      if (iVar4 != -1) {
        pjVar13 = (job_t *)0x0;
LAB_00107d59:
        uVar10 = (ulong)pUVar6->i;
        if (pjVar13 == (job_t *)0x0) {
          if (uVar10 == 0) goto LAB_00107ec1;
          pjVar13 = (job_t *)pUVar6->d;
        }
        else {
          pjVar7 = (job_t *)pUVar6->d;
          if (pjVar13 < pjVar7) {
            if (uVar10 == 0) goto LAB_00107ec1;
            pjVar12 = (job_t *)(pUVar6->icd).sz;
            uVar8 = 0;
          }
          else {
            pjVar12 = (job_t *)(pUVar6->icd).sz;
            uVar8 = (ulong)((long)pjVar13 - (long)pjVar7) / (ulong)pjVar12 + 1;
            if (uVar10 <= uVar8) goto LAB_00107ec1;
          }
          pjVar12 = (job_t *)((long)pjVar12 * uVar8);
          pjVar13 = (job_t *)((long)&pjVar12->name + (long)&pjVar7->name);
        }
        if (pjVar13 == (job_t *)0x0) goto LAB_00107ec1;
        pjVar12 = (job_t *)pjVar13->name;
        pjVar7 = get_job_by_name(jobs,(char *)pjVar12);
        if (pjVar7 != (job_t *)0x0) {
          iVar4 = job_cmp(pjVar13,pjVar7);
          if (iVar4 == 0) {
            job_fin(pjVar13);
            job_cpy(pjVar13,pjVar7);
          }
          else {
            pjVar13->start_ts = pjVar7->start_ts;
            iVar4 = pjVar7->pid;
            pjVar13->pid = iVar4;
            if (iVar4 != 0) {
              pjVar13->terminate = 1;
            }
          }
          pjVar12 = (job_t *)(jobs->icd).dtor;
          if (pjVar12 != (job_t *)0x0) {
            pjVar2 = (job_t *)jobs->d;
            uVar10 = (long)pjVar7 - (long)pjVar2;
            if (pjVar7 < pjVar2) {
              pcVar5 = (char *)0x0;
            }
            else {
              uVar8 = (jobs->icd).sz;
              pcVar5 = (char *)0x0;
              if (uVar10 / uVar8 < (ulong)jobs->i) {
                pcVar5 = (char *)((long)pjVar2 + (uVar10 - uVar10 % uVar8));
              }
            }
            (*(code *)pjVar12)(pcVar5);
          }
          uVar9 = jobs->i;
          pjVar2 = (job_t *)jobs->d;
          uVar10 = (long)pjVar7 - (long)pjVar2;
          if (pjVar7 < pjVar2) {
            if (uVar9 == 0) {
              uVar9 = 0;
            }
            else {
              uVar8 = (jobs->icd).sz;
              lVar14 = -uVar8;
              uVar10 = 0;
              pjVar12 = pjVar2;
LAB_00107e9f:
              memmove((code *)((long)&pjVar2->name + lVar14),pjVar12,
                      (long)((long)&((job_t *)(ulong)uVar9)->name + uVar10) * uVar8);
              uVar9 = jobs->i;
            }
          }
          else {
            uVar8 = (jobs->icd).sz;
            pjVar12 = (job_t *)(uVar10 / uVar8 + 1);
            if (pjVar12 < (job_t *)(ulong)uVar9) {
              lVar14 = uVar10 - uVar10 % uVar8;
              pjVar12 = (job_t *)((long)&pjVar2->name + (long)pjVar12 * uVar8);
              uVar10 = ~(uVar10 / uVar8);
              goto LAB_00107e9f;
            }
          }
          jobs->i = uVar9 - 1;
        }
        goto LAB_00107d59;
      }
      syslog(2,"FAILED to parse %s",cfg.file);
      syslog(2,"ERROR: %s",em->name);
      syslog(2,"NOTE: using PREVIOUS job config");
      cfg.jobs = jobs;
      goto LAB_00108088;
    }
  }
LAB_001080ab:
  exit(-1);
LAB_00107ec1:
  pjVar13 = (job_t *)0x0;
LAB_00107ed3:
  uVar9 = jobs->i;
  if (pjVar13 == (job_t *)0x0) {
    if (uVar9 == 0) {
LAB_0010803f:
      uVar9 = 0;
LAB_00108041:
      if (jobs->n != 0) {
        if (uVar9 != 0 && (jobs->icd).dtor != (undefined1 *)0x0) {
          uVar10 = 0;
          do {
            (*(code *)(jobs->icd).dtor)(jobs->d + (jobs->icd).sz * uVar10);
            uVar10 = uVar10 + 1;
          } while (uVar10 < jobs->i);
        }
        free(jobs->d);
      }
      free(jobs);
LAB_00108088:
      if (em->name != (char *)0x0) {
        free(em->name);
      }
      free(em);
      return;
    }
    pjVar13 = (job_t *)jobs->d;
  }
  else {
    pjVar12 = (job_t *)jobs->d;
    if (pjVar13 < pjVar12) {
      if (uVar9 == 0) goto LAB_0010803f;
      uVar10 = (jobs->icd).sz;
      uVar8 = 0;
    }
    else {
      uVar10 = (jobs->icd).sz;
      uVar8 = (ulong)((long)pjVar13 - (long)pjVar12) / uVar10 + 1;
      if (uVar9 <= uVar8) goto LAB_00108041;
    }
    pjVar12 = (job_t *)((long)&pjVar12->name + uVar10 * uVar8);
    pjVar13 = pjVar12;
  }
  if (pjVar13 == (job_t *)0x0) goto LAB_00108041;
  if (pjVar13->pid != 0) {
    pjVar13->terminate = 1;
    pjVar13->respawn = 0;
    pjVar13->delete_when_collected = 1;
    (em->cmdv).icd.sz = 0;
    *em->name = '\0';
    utstring_printf((UT_string *)em,(char *)pjVar12,pjVar13->name);
    free(pjVar13->name);
    pcVar5 = strdup(em->name);
    pjVar13->name = pcVar5;
    pUVar6 = cfg.jobs;
    uVar9 = (cfg.jobs)->n;
    uVar11 = (cfg.jobs)->i + 1;
    if (uVar9 < uVar11) {
      do {
        bVar15 = uVar9 == 0;
        uVar9 = uVar9 * 2;
        if (bVar15) {
          uVar9 = 8;
        }
      } while (uVar9 < uVar11);
      (cfg.jobs)->n = uVar9;
      pcVar5 = (char *)realloc(pUVar6->d,(ulong)uVar9 * (pUVar6->icd).sz);
      (cfg.jobs)->d = pcVar5;
      if (pcVar5 == (char *)0x0) goto LAB_001080ab;
    }
    pcVar3 = ((cfg.jobs)->icd).copy;
    __n = ((cfg.jobs)->icd).sz;
    uVar9 = (cfg.jobs)->i;
    ppcVar1 = &(cfg.jobs)->d;
    (cfg.jobs)->i = uVar9 + 1;
    pjVar12 = pjVar13;
    if (pcVar3 == (ctor_f *)0x0) {
      memcpy(*ppcVar1 + uVar9 * __n,pjVar13,__n);
    }
    else {
      (*pcVar3)(*ppcVar1 + uVar9 * __n,pjVar13);
    }
  }
  goto LAB_00107ed3;
}

Assistant:

void rescan_config(void) {
  job_t *job, *old;
  int c;

  syslog(LOG_INFO,"rescanning job configuration");
  UT_string *em; utstring_new(em);
  UT_array *previous_jobs = cfg.jobs;
  UT_array *new_jobs; utarray_new(new_jobs, &job_mm); cfg.jobs = new_jobs;

  /* udp sockets get re-opened during config parsing */
  close_sockets(&cfg); 

  if (parse_jobs(&cfg, em) == -1) {
    syslog(LOG_CRIT,"FAILED to parse %s", cfg.file);
    syslog(LOG_CRIT,"ERROR: %s", utstring_body(em));
    syslog(LOG_CRIT,"NOTE: using PREVIOUS job config");
    cfg.jobs = previous_jobs;
    goto done;
  }

  /* parse succeeded. diff the new jobs vs. existing jobs */
  job=NULL;
  while( (job = (job_t*)utarray_next(new_jobs,job))) {
    old = get_job_by_name(previous_jobs, job->name);
    if (!old) continue;          // new job definition; startup forthcoming.
    c = job_cmp(job,old);        
    if (c == 0) {                // new job with same name and identical to old:
      job_fin(job);              // free up new job,
      job_cpy(job,old);          // and copy old job into new to retain pid etc.
    } else {                     // new job with same name, but new config:
      job->start_ts = old->start_ts;
      job->pid = old->pid;
      if (job->pid) job->terminate=1;// induce reset to pick up new settings.
    }
    utarray_erase(previous_jobs, utarray_eltidx(previous_jobs,old), 1);
  }
  /* any jobs left in previous_jobs are no longer in the new configuration */
  old=NULL;
  while ( (old=(job_t*)utarray_next(previous_jobs,old))) {
    if (old->pid == 0) continue; /* not running. free it below. */
    /* terminate old job, but keep a record of it til it exits */
    old->terminate=1;
    old->respawn=0;
    old->delete_when_collected=1;
    utstring_clear(em); utstring_printf(em, "%s(deleted)", old->name);
    free(old->name); old->name = strdup(utstring_body(em));
    utarray_push_back(cfg.jobs, old); 
  }
  utarray_free(previous_jobs);

 done:
  utstring_free(em);
}